

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

cmJSONHelper<std::nullptr_t,_ReadFileResult> *
cmCMakePresetsGraphInternal::VendorHelper(ReadFileResult error)

{
  cmJSONHelper<std::nullptr_t,_ReadFileResult> *in_RDI;
  
  *(undefined8 *)&(in_RDI->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(in_RDI->super__Function_base)._M_functor + 8) = 0;
  (in_RDI->super__Function_base)._M_manager = (_Manager_type)0x0;
  in_RDI->_M_invoker = (_Invoker_type)0x0;
  *(ReadFileResult *)&(in_RDI->super__Function_base)._M_functor = error;
  in_RDI->_M_invoker =
       std::
       _Function_handler<cmCMakePresetsGraph::ReadFileResult_(std::nullptr_t_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraphReadJSON.cxx:368:10)>
       ::_M_invoke;
  (in_RDI->super__Function_base)._M_manager =
       std::
       _Function_handler<cmCMakePresetsGraph::ReadFileResult_(std::nullptr_t_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraphReadJSON.cxx:368:10)>
       ::_M_manager;
  return in_RDI;
}

Assistant:

cmJSONHelper<std::nullptr_t, ReadFileResult> VendorHelper(ReadFileResult error)
{
  return [error](std::nullptr_t& /*out*/,
                 const Json::Value* value) -> ReadFileResult {
    if (!value) {
      return ReadFileResult::READ_OK;
    }

    if (!value->isObject()) {
      return error;
    }

    return ReadFileResult::READ_OK;
  };
}